

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall
Buffer_make_contiguous_when_only_one_page_Test::~Buffer_make_contiguous_when_only_one_page_Test
          (Buffer_make_contiguous_when_only_one_page_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, make_contiguous_when_only_one_page) {
    BufferWithLocalArray<64> local;

    bfy_buffer_add(&local.buf, std::data(str1), std::size(str1));

    // confirm adding str1 fit inside the existing page
    auto constexpr n_expected_vecs = 1;
    auto vecs1 = std::array<bfy_iovec, n_expected_vecs>{};
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&local.buf, std::data(vecs1), std::size(vecs1)));
    EXPECT_EQ(std::data(local.array), vecs1[0].iov_base);
    EXPECT_EQ(std::size(str1), vecs1[0].iov_len);

    // confirm that making contiguous changes nothing
    // because it was already a single page
    auto* rv = bfy_buffer_make_all_contiguous(&local.buf);
    auto vecs2 = std::array<bfy_iovec, n_expected_vecs>{};
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&local.buf, std::data(vecs2), std::size(vecs2)));
    EXPECT_EQ(vecs1[0].iov_base, vecs2[0].iov_base);

    // confirm that make_contiguous() returned the right value
    EXPECT_EQ(vecs1[0].iov_base, rv);
}